

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O0

collision_shape_ptr __thiscall
APhyBullet::BulletEngine::createConeY(BulletEngine *this,aphy_scalar radius,aphy_scalar height)

{
  Counter *pCVar1;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  btConeShape *in_stack_ffffffffffffffb8;
  ref<aphy::collision_shape> *this_00;
  btScalar in_stack_ffffffffffffffe8;
  btScalar in_stack_ffffffffffffffec;
  
  btConeShape::operator_new(0x12839f);
  btConeShape::btConeShape
            ((btConeShape *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_stack_ffffffffffffffec,
             in_stack_ffffffffffffffe8);
  this_00 = (ref<aphy::collision_shape> *)&stack0xffffffffffffffe8;
  aphy::makeObject<APhyBullet::BulletCollisionShape,btConeShape*>(in_stack_ffffffffffffffb8);
  pCVar1 = aphy::ref<aphy::collision_shape>::disown(this_00);
  aphy::ref<aphy::collision_shape>::~ref(this_00);
  return pCVar1;
}

Assistant:

collision_shape_ptr BulletEngine::createConeY(aphy_scalar radius, aphy_scalar height)
{
    return makeObject<BulletCollisionShape> (
        new btConeShape(radius, height)
    ).disown();
}